

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.h
# Opt level: O0

void __thiscall re2::RE2::Options::Options(Options *this)

{
  Options *this_local;
  
  this->encoding_ = EncodingUTF8;
  this->posix_syntax_ = false;
  this->longest_match_ = false;
  this->log_errors_ = true;
  this->max_mem_ = 0x800000;
  this->literal_ = false;
  this->never_nl_ = false;
  this->dot_nl_ = false;
  this->never_capture_ = false;
  this->case_sensitive_ = true;
  this->perl_classes_ = false;
  this->word_boundary_ = false;
  this->one_line_ = false;
  return;
}

Assistant:

Options() :
      encoding_(EncodingUTF8),
      posix_syntax_(false),
      longest_match_(false),
      log_errors_(true),
      max_mem_(kDefaultMaxMem),
      literal_(false),
      never_nl_(false),
      dot_nl_(false),
      never_capture_(false),
      case_sensitive_(true),
      perl_classes_(false),
      word_boundary_(false),
      one_line_(false) {
    }